

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

int rply_vertex_callback_vec3(p_ply_argument argument)

{
  double dVar1;
  long index;
  float *buffer;
  
  ply_get_argument_user_data(argument,&buffer,(long *)0x0);
  ply_get_argument_element(argument,(p_ply_element *)0x0,&index);
  dVar1 = ply_get_argument_value(argument);
  buffer[index * 3] = (float)dVar1;
  return 1;
}

Assistant:

static int rply_vertex_callback_vec3(p_ply_argument argument) {
  float* buffer;
  ply_get_argument_user_data(argument, (void**)&buffer, nullptr);

  long index;
  ply_get_argument_element(argument, nullptr, &index);

  float value = (float)ply_get_argument_value(argument);
  buffer[index * 3] = value;
  return 1;
}